

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::mapName(wasm::
ModuleItemKind,wasm::Name__(void *this,ModuleItemKind kind,Name *name)

{
  iterator iVar1;
  iterator iVar2;
  size_type sVar3;
  undefined1 local_210 [392];
  undefined1 local_88 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> visited;
  key_type local_48;
  ModuleItemKind local_34 [2];
  ModuleItemKind kind_local;
  
  local_34[0] = kind;
  iVar1 = std::
          _Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(*(_Hashtable<wasm::ModuleItemKind,_std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::ModuleItemKind>,_std::hash<wasm::ModuleItemKind>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   **)((long)this + 0x130),local_34);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    iVar2 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)((long)iVar1.
                             super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                             ._M_cur + 0x10),name);
    if (iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur !=
        (__node_type *)0x0) {
      local_48.super_IString.str._M_len =
           *(size_t *)
            ((long)iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>.
                   _M_cur + 0x18);
      local_48.super_IString.str._M_str =
           *(char **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                            ._M_cur + 0x20);
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = (name->super_IString).str._M_len;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&visited;
      visited._M_t._M_impl._0_4_ = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      while( true ) {
        iVar2 = std::
                _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)((long)iVar1.
                                 super__Node_iterator_base<std::pair<const_wasm::ModuleItemKind,_std::unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>_>,_false>
                                 ._M_cur + 0x10),&local_48);
        if (iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur ==
            (__node_type *)0x0) break;
        sVar3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                          ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                           local_88,&local_48);
        if (sVar3 != 0) {
          wasm::Fatal::Fatal((Fatal *)local_210);
          std::operator<<((ostream *)(local_210 + 0x10),"wasm-merge: infinite loop of imports on ");
          wasm::Fatal::operator<<
                    ((Fatal *)local_210,
                     (Name *)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count);
          wasm::Fatal::~Fatal((Fatal *)local_210);
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_88,&local_48);
        local_48.super_IString.str._M_len =
             *(size_t *)
              ((long)iVar2.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>.
                     _M_cur + 0x18);
        local_48.super_IString.str._M_str =
             *(char **)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                              ._M_cur + 0x20);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_88);
      (name->super_IString).str._M_len = local_48.super_IString.str._M_len;
      (name->super_IString).str._M_str = local_48.super_IString.str._M_str;
    }
  }
  return;
}

Assistant:

void mapName(ModuleItemKind kind, Name& name) {
      auto iter = kindNameUpdates.find(kind);
      if (iter == kindNameUpdates.end()) {
        return;
      }
      auto& nameUpdates = iter->second;
      auto iter2 = nameUpdates.find(name);
      if (iter2 != nameUpdates.end()) {
        name = resolveName(nameUpdates, iter2->second, name);
      }
    }